

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_window.cpp
# Opt level: O0

bool one_object_selected_proc(Am_Object *self)

{
  unsigned_short uVar1;
  Am_Value *pAVar2;
  undefined1 local_48 [8];
  Am_Value_List selection;
  Am_Object sel_widget;
  Am_Object local_20;
  Am_Object local_18;
  Am_Object search_widget;
  Am_Object *self_local;
  
  search_widget.data = (Am_Object_Data *)self;
  Am_Object::Get_Object(&local_20,(Am_Slot_Key)self,0x170);
  Am_Object::Get_Owner(&local_18,(Am_Slot_Flags)&local_20);
  Am_Object::~Am_Object(&local_20);
  pAVar2 = Am_Object::Get(&local_18,0x197,0);
  Am_Object::Am_Object((Am_Object *)&selection.item,pAVar2);
  pAVar2 = Am_Object::Get((Am_Object *)&selection.item,0x169,0);
  Am_Value_List::Am_Value_List((Am_Value_List *)local_48,pAVar2);
  uVar1 = Am_Value_List::Length((Am_Value_List *)local_48);
  Am_Value_List::~Am_Value_List((Am_Value_List *)local_48);
  Am_Object::~Am_Object((Am_Object *)&selection.item);
  Am_Object::~Am_Object(&local_18);
  return uVar1 == 1;
}

Assistant:

Am_Define_Formula(bool, one_object_selected)
{
  Am_Object search_widget = self.Get_Object(Am_SAVED_OLD_OWNER).Get_Owner();
  Am_Object sel_widget = search_widget.Get(Am_SELECTION_WIDGET);
  Am_Value_List selection = sel_widget.Get(Am_VALUE);
  return (selection.Length() == 1);
}